

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AppleII.cpp
# Opt level: O2

void __thiscall
Apple::II::ConcreteMachine<(Analyser::Static::AppleII::Target::Model)1,_true>::ConcreteMachine
          (ConcreteMachine<(Analyser::Static::AppleII::Target::Model)1,_true> *this,Target *target,
          ROMFetcher *rom_fetcher)

{
  AsyncTaskQueue<false,_true,_void> *this_00;
  StretchedAYPair *this_01;
  Model MVar1;
  DiskController DVar2;
  SCSIController SVar3;
  const_iterator __first;
  pointer puVar4;
  Name name;
  bool bVar5;
  DiskIICard *this_02;
  SCSICard *this_03;
  Mockingboard *this_04;
  iterator iVar6;
  undefined4 *puVar7;
  Name name_00;
  float cycles_per_second;
  float high_frequency;
  Name system;
  Name character;
  Target *local_100;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_f8;
  LowpassBase<Outputs::Speaker::PullLowpass<Outputs::Speaker::CompoundSource<(anonymous_namespace)::StretchedAYPair,_Audio::Toggle>_>,_true>
  *local_f0;
  map<ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  roms;
  Request local_a8;
  Keyboard *local_80;
  MappedKeyboardMachine *local_78;
  AYPair *local_70;
  ROMFetcher *local_68;
  uint8_t *local_60;
  Request request;
  
  (this->super_Machine)._vptr_Machine = (_func_int **)&PTR__Machine_0057e418;
  (this->super_TimedMachine)._vptr_TimedMachine = (_func_int **)&PTR_run_for_0057d638;
  (this->super_TimedMachine).clock_rate_ = 1.0;
  (this->super_TimedMachine).clock_conversion_error_ = 0.0;
  (this->super_TimedMachine).speed_multiplier_ = 1.0;
  (this->super_ScanProducer)._vptr_ScanProducer = (_func_int **)&PTR___cxa_pure_virtual_0057d600;
  (this->super_AudioProducer)._vptr_AudioProducer = (_func_int **)&PTR___cxa_pure_virtual_0057cd58;
  (this->super_MediaTarget)._vptr_MediaTarget = (_func_int **)&PTR___cxa_pure_virtual_0057d680;
  local_78 = &this->super_MappedKeyboardMachine;
  roms._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &roms._M_t._M_impl.super__Rb_tree_header._M_header;
  roms._M_t._M_impl._0_8_ = 0;
  roms._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  roms._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  roms._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  roms._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_100 = target;
  roms._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       roms._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  MachineTypes::MappedKeyboardMachine::MappedKeyboardMachine
            (local_78,(set<Inputs::Keyboard::Key,_std::less<Inputs::Keyboard::Key>,_std::allocator<Inputs::Keyboard::Key>_>
                       *)&roms);
  std::
  _Rb_tree<Inputs::Keyboard::Key,_Inputs::Keyboard::Key,_std::_Identity<Inputs::Keyboard::Key>,_std::less<Inputs::Keyboard::Key>,_std::allocator<Inputs::Keyboard::Key>_>
  ::~_Rb_tree((_Rb_tree<Inputs::Keyboard::Key,_Inputs::Keyboard::Key,_std::_Identity<Inputs::Keyboard::Key>,_std::less<Inputs::Keyboard::Key>,_std::allocator<Inputs::Keyboard::Key>_>
               *)&roms);
  (this->super_Machine)._vptr_Machine = (_func_int **)&PTR__ConcreteMachine_0057e750;
  (this->super_TimedMachine)._vptr_TimedMachine = (_func_int **)&PTR_run_for_0057e800;
  (this->super_ScanProducer)._vptr_ScanProducer = (_func_int **)&PTR_set_scan_target_0057e848;
  (this->super_AudioProducer)._vptr_AudioProducer = (_func_int **)&DAT_0057e880;
  (this->super_MediaTarget)._vptr_MediaTarget = (_func_int **)&DAT_0057e898;
  (this->super_MappedKeyboardMachine).super_Delegate._vptr_Delegate =
       (_func_int **)&PTR_keyboard_did_change_key_0057e8b0;
  (this->super_MappedKeyboardMachine).super_KeyboardMachine.super_KeyActions._vptr_KeyActions =
       (_func_int **)&PTR_set_key_state_0057e8e0;
  (this->super_JoystickMachine)._vptr_JoystickMachine = (_func_int **)&DAT_0057e920;
  (this->super_Device)._vptr_Device = (_func_int **)&PTR_set_options_0057e938;
  (this->super_Source)._vptr_Source = (_func_int **)&DAT_0057e958;
  (this->super_Delegate)._vptr_Delegate =
       (_func_int **)&PTR_card_did_change_select_constraints_0057e970;
  CPU::MOS6502::
  Processor<(CPU::MOS6502::Personality)1,_Apple::II::ConcreteMachine<(Analyser::Static::AppleII::Target::Model)1,_true>,_false>
  ::Processor(&this->m6502_,this);
  local_60 = this->aux_ram_;
  (this->video_bus_handler_).ram_ = this->ram_;
  (this->video_bus_handler_).aux_ram_ = local_60;
  II::Video::
  Video<Apple::II::ConcreteMachine<(Analyser::Static::AppleII::Target::Model)1,_true>::VideoBusHandler,_false>
  ::Video(&this->video_,&this->video_bus_handler_);
  this->cycles_into_current_line_ = 0;
  (this->cycles_since_video_update_).super_WrappedInt<Cycles>.length_ = 0;
  local_f8 = &this->rom_;
  (this->rom_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->rom_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->rom_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00 = &this->audio_queue_;
  local_68 = rom_fetcher;
  Concurrency::AsyncTaskQueue<false,_true,_void>::AsyncTaskQueue<>(this_00);
  Audio::Toggle::Toggle(&this->audio_toggle_,this_00);
  this_01 = &this->ays_;
  anon_unknown.dwarf_7995ed::StretchedAYPair::AYPair(this_01,this_00);
  Outputs::Speaker::CompoundSource<(anonymous_namespace)::StretchedAYPair,_Audio::Toggle>::
  CompoundSource(&this->mixer_,this_01,&this->audio_toggle_);
  local_f0 = &(this->speaker_).
              super_LowpassBase<Outputs::Speaker::PullLowpass<Outputs::Speaker::CompoundSource<(anonymous_namespace)::StretchedAYPair,_Audio::Toggle>_>,_true>
  ;
  local_70 = &this_01->super_AYPair;
  Outputs::Speaker::
  PullLowpass<Outputs::Speaker::CompoundSource<(anonymous_namespace)::StretchedAYPair,_Audio::Toggle>_>
  ::PullLowpass((PullLowpass<Outputs::Speaker::CompoundSource<(anonymous_namespace)::StretchedAYPair,_Audio::Toggle>_>
                 *)local_f0,&this->mixer_);
  (this->cycles_since_audio_update_).super_WrappedInt<Cycles>.length_ = 0;
  this->active_card_ = 7;
  (this->cards_)._M_elems[0]._M_t.
  super___uniq_ptr_impl<Apple::II::Card,_std::default_delete<Apple::II::Card>_>._M_t.
  super__Tuple_impl<0UL,_Apple::II::Card_*,_std::default_delete<Apple::II::Card>_>.
  super__Head_base<0UL,_Apple::II::Card_*,_false>._M_head_impl = (Card *)0x0;
  (this->cards_)._M_elems[1]._M_t.
  super___uniq_ptr_impl<Apple::II::Card,_std::default_delete<Apple::II::Card>_>._M_t.
  super__Tuple_impl<0UL,_Apple::II::Card_*,_std::default_delete<Apple::II::Card>_>.
  super__Head_base<0UL,_Apple::II::Card_*,_false>._M_head_impl = (Card *)0x0;
  (this->cards_)._M_elems[2]._M_t.
  super___uniq_ptr_impl<Apple::II::Card,_std::default_delete<Apple::II::Card>_>._M_t.
  super__Tuple_impl<0UL,_Apple::II::Card_*,_std::default_delete<Apple::II::Card>_>.
  super__Head_base<0UL,_Apple::II::Card_*,_false>._M_head_impl = (Card *)0x0;
  (this->cards_)._M_elems[3]._M_t.
  super___uniq_ptr_impl<Apple::II::Card,_std::default_delete<Apple::II::Card>_>._M_t.
  super__Tuple_impl<0UL,_Apple::II::Card_*,_std::default_delete<Apple::II::Card>_>.
  super__Head_base<0UL,_Apple::II::Card_*,_false>._M_head_impl = (Card *)0x0;
  (this->cards_)._M_elems[4]._M_t.
  super___uniq_ptr_impl<Apple::II::Card,_std::default_delete<Apple::II::Card>_>._M_t.
  super__Tuple_impl<0UL,_Apple::II::Card_*,_std::default_delete<Apple::II::Card>_>.
  super__Head_base<0UL,_Apple::II::Card_*,_false>._M_head_impl = (Card *)0x0;
  (this->cards_)._M_elems[5]._M_t.
  super___uniq_ptr_impl<Apple::II::Card,_std::default_delete<Apple::II::Card>_>._M_t.
  super__Tuple_impl<0UL,_Apple::II::Card_*,_std::default_delete<Apple::II::Card>_>.
  super__Head_base<0UL,_Apple::II::Card_*,_false>._M_head_impl = (Card *)0x0;
  (this->cards_)._M_elems[6]._M_t.
  super___uniq_ptr_impl<Apple::II::Card,_std::default_delete<Apple::II::Card>_>._M_t.
  super__Tuple_impl<0UL,_Apple::II::Card_*,_std::default_delete<Apple::II::Card>_>.
  super__Head_base<0UL,_Apple::II::Card_*,_false>._M_head_impl = (Card *)0x0;
  (this->cards_)._M_elems[7]._M_t.
  super___uniq_ptr_impl<Apple::II::Card,_std::default_delete<Apple::II::Card>_>._M_t.
  super__Tuple_impl<0UL,_Apple::II::Card_*,_std::default_delete<Apple::II::Card>_>.
  super__Head_base<0UL,_Apple::II::Card_*,_false>._M_head_impl = (Card *)0x0;
  (this->cycles_since_card_update_).super_WrappedInt<Cycles>.length_ = 0;
  (this->every_cycle_cards_).
  super__Vector_base<Apple::II::Card_*,_std::allocator<Apple::II::Card_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->every_cycle_cards_).
  super__Vector_base<Apple::II::Card_*,_std::allocator<Apple::II::Card_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->every_cycle_cards_).
  super__Vector_base<Apple::II::Card_*,_std::allocator<Apple::II::Card_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->just_in_time_cards_).
  super__Vector_base<Apple::II::Card_*,_std::allocator<Apple::II::Card_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->just_in_time_cards_).
  super__Vector_base<Apple::II::Card_*,_std::allocator<Apple::II::Card_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->just_in_time_cards_).
           super__Vector_base<Apple::II::Card_*,_std::allocator<Apple::II::Card_*>_>._M_impl.
           super__Vector_impl_data._M_finish + 4) = 0;
  *(undefined8 *)
   ((long)&(this->just_in_time_cards_).
           super__Vector_base<Apple::II::Card_*,_std::allocator<Apple::II::Card_*>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage + 4) = 0;
  this->card_lists_are_dirty_ = true;
  this->card_became_just_in_time_ = false;
  (this->language_card_).machine_ = this;
  (this->language_card_).state_.bank2 = true;
  (this->language_card_).state_.read = false;
  (this->language_card_).state_.write = false;
  (this->language_card_).pre_write_ = false;
  (this->auxiliary_switches_).machine_ = this;
  (this->auxiliary_switches_).switches_.read_auxiliary_memory = false;
  (this->auxiliary_switches_).switches_.write_auxiliary_memory = false;
  (this->auxiliary_switches_).switches_.internal_CX_rom = false;
  (this->auxiliary_switches_).switches_.slot_C3_rom = false;
  (this->auxiliary_switches_).switches_.internal_C8_rom = false;
  (this->auxiliary_switches_).switches_.store_80 = false;
  (this->auxiliary_switches_).switches_.alternative_zero_page = false;
  (this->auxiliary_switches_).switches_.video_page_2 = false;
  *(undefined8 *)&(this->auxiliary_switches_).switches_.high_resolution = 0;
  (this->auxiliary_switches_).card_state_.region_C1_C3 = false;
  (this->auxiliary_switches_).card_state_.region_C3 = false;
  (this->auxiliary_switches_).card_state_.region_C4_C8 = false;
  (this->auxiliary_switches_).card_state_.region_C8_D0 = false;
  local_80 = &this->keyboard_;
  Keyboard::Keyboard(local_80,&this->m6502_);
  JoystickPair::JoystickPair(&this->joysticks_);
  (this->super_TimedMachine).clock_rate_ = 1020484.3201754387;
  Outputs::Speaker::
  LowpassBase<Outputs::Speaker::PullLowpass<Outputs::Speaker::CompoundSource<(anonymous_namespace)::StretchedAYPair,_Audio::Toggle>_>,_true>
  ::set_input_rate(local_f0,cycles_per_second);
  Outputs::Speaker::
  LowpassBase<Outputs::Speaker::PullLowpass<Outputs::Speaker::CompoundSource<(anonymous_namespace)::StretchedAYPair,_Audio::Toggle>_>,_true>
  ::set_high_frequency_cutoff(local_f0,high_frequency);
  Memory::Fuzz(this->ram_,0x10000);
  Memory::Fuzz(local_60,0x10000);
  MVar1 = local_100->model;
  name_00 = AppleIICharacter;
  if (MVar1 == IIplus) {
    character = AppleIICharacter;
    system = AppleIIPlus;
    name = AppleIIPlus;
  }
  else if (MVar1 == IIe) {
    character = AppleIIeCharacter;
    system = AppleIIe;
    name_00 = AppleIIeCharacter;
    name = AppleIIe;
  }
  else if (MVar1 == EnhancedIIe) {
    character = AppleIIEnhancedECharacter;
    system = AppleIIEnhancedE;
    name_00 = AppleIIEnhancedECharacter;
    name = AppleIIEnhancedE;
  }
  else {
    character = AppleIICharacter;
    system = AppleIIOriginal;
    name = AppleIIOriginal;
  }
  ROM::Request::Request((Request *)&roms,name_00,false);
  ROM::Request::Request(&local_a8,name,false);
  ROM::Request::operator&&(&request,(Request *)&roms,&local_a8);
  std::vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>::~vector
            (&local_a8.node.children);
  std::vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>::~vector
            ((vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_> *)
             &roms._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
  DVar2 = local_100->disk_controller;
  if (DVar2 != None) {
    DiskIICard::rom_request(&local_a8,DVar2 == SixteenSector);
    ROM::Request::operator&&((Request *)&roms,&request,&local_a8);
    ROM::Request::Node::operator=(&request.node,(Node *)&roms);
    std::vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>::~vector
              ((vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_> *)
               &roms._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
    std::vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>::~vector
              (&local_a8.node.children);
  }
  SVar3 = local_100->scsi_controller;
  if (SVar3 == AppleSCSI) {
    SCSICard::rom_request();
    ROM::Request::operator&&((Request *)&roms,&request,&local_a8);
    ROM::Request::Node::operator=(&request.node,(Node *)&roms);
    std::vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>::~vector
              ((vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_> *)
               &roms._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
    std::vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>::~vector
              (&local_a8.node.children);
  }
  std::
  function<std::map<ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_(const_ROM::Request_&)>
  ::operator()(&roms,local_68,&request);
  bVar5 = ROM::Request::validate(&request,&roms);
  if (bVar5) {
    if (DVar2 != None) {
      this_02 = (DiskIICard *)operator_new(0x478);
      DiskIICard::DiskIICard(this_02,&roms,DVar2 == SixteenSector);
      install_card(this,6,(Card *)this_02);
    }
    if (SVar3 == AppleSCSI) {
      this_03 = (SCSICard *)operator_new(0x61d8);
      SCSICard::SCSICard(this_03,&roms,0xf9b07);
      install_card(this,7,(Card *)this_03);
    }
    if (local_100->has_mockingboard == true) {
      this_04 = (Mockingboard *)operator_new(0x108);
      Mockingboard::Mockingboard(this_04,local_70);
      install_card(this,4,(Card *)this_04);
    }
    iVar6 = std::
            _Rb_tree<ROM::Name,_std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::_Select1st<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
            ::find(&roms._M_t,&system);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
              (local_f8,&iVar6._M_node[1]._M_parent);
    if ((system & ~AcornElectronMOS100) == AppleIIe) {
      __first._M_current =
           (this->rom_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
      puVar4 = (this->rom_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      if (0x3f00 < (ulong)((long)puVar4 - (long)__first._M_current)) {
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::erase
                  (local_f8,__first,(const_iterator)(puVar4 + -0x3f00));
      }
    }
    iVar6 = std::
            _Rb_tree<ROM::Name,_std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::_Select1st<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
            ::find(&roms._M_t,&character);
    VideoSwitches<Cycles>::set_character_rom
              ((VideoSwitches<Cycles> *)&this->video_,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&iVar6._M_node[1]._M_parent)
    ;
    set_paging<3>(this);
    page(this,0xc0,0xd0,(uint8_t *)0x0,(uint8_t *)0x0);
    insert_media(this,&(local_100->super_Target).media);
    std::
    _Rb_tree<ROM::Name,_std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::_Select1st<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
    ::~_Rb_tree(&roms._M_t);
    std::vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>::~vector
              (&request.node.children);
    return;
  }
  puVar7 = (undefined4 *)__cxa_allocate_exception(4);
  *puVar7 = 0;
  __cxa_throw(puVar7,&ROMMachine::Error::typeinfo,0);
}

Assistant:

ConcreteMachine(const Analyser::Static::AppleII::Target &target, const ROMMachine::ROMFetcher &rom_fetcher):
			m6502_(*this),
			video_bus_handler_(ram_, aux_ram_),
			video_(video_bus_handler_),
			audio_toggle_(audio_queue_),
			ays_(audio_queue_),
			mixer_(ays_, audio_toggle_),
			speaker_(lowpass_source()),
			language_card_(*this),
			auxiliary_switches_(*this),
			keyboard_(&m6502_) {

			// This is where things get slightly convoluted: establish the machine as having a clock rate
			// equal to the number of cycles of work the 6502 will actually achieve. Which is less than
			// the master clock rate divided by 14 because every 65th cycle is extended by one seventh.
			set_clock_rate((master_clock / 14.0) * 65.0 / (65.0 + 1.0 / 7.0));

			// The speaker, however, should think it is clocked at half the master clock, per a general
			// decision to sample it at seven times the CPU clock (plus stretches).
			speaker_.set_input_rate(float(master_clock / (2.0 * float(audio_divider))));

			// Apply a 6Khz low-pass filter. This was picked by ear and by an attempt to understand the
			// Apple II schematic but, well, I don't claim much insight on the latter. This is definitely
			// something to review in the future.
			speaker_.set_high_frequency_cutoff(6000);

			// Also, start with randomised memory contents.
			Memory::Fuzz(ram_, sizeof(ram_));
			Memory::Fuzz(aux_ram_, sizeof(aux_ram_));

			// Pick the required ROMs.
			using Target = Analyser::Static::AppleII::Target;
			ROM::Name character, system;

			switch(target.model) {
				default:
					character = ROM::Name::AppleIICharacter;
					system = ROM::Name::AppleIIOriginal;
				break;
				case Target::Model::IIplus:
					character = ROM::Name::AppleIICharacter;
					system = ROM::Name::AppleIIPlus;
				break;
				case Target::Model::IIe:
					character = ROM::Name::AppleIIeCharacter;
					system = ROM::Name::AppleIIe;
				break;
				case Target::Model::EnhancedIIe:
					character = ROM::Name::AppleIIEnhancedECharacter;
					system = ROM::Name::AppleIIEnhancedE;
				break;
			}

			ROM::Request request = ROM::Request(character) && ROM::Request(system);

			// Add the necessary Disk II requests if appropriate.
			const bool has_disk_controller = target.disk_controller != Target::DiskController::None;
			const bool is_sixteen_sector = target.disk_controller == Target::DiskController::SixteenSector;
			if(has_disk_controller) {
				request = request && DiskIICard::rom_request(is_sixteen_sector);
			}

			// Add a SCSI card if requested.
			const bool has_scsi_card = target.scsi_controller == Target::SCSIController::AppleSCSI;
			if(has_scsi_card) {
				request = request && SCSICard::rom_request();
			}

			// Request, validate and install ROMs.
			auto roms = rom_fetcher(request);
			if(!request.validate(roms)) {
				throw ROMMachine::Error::MissingROMs;
			}

			if(has_disk_controller) {
				install_card(DiskIISlot, new Apple::II::DiskIICard(roms, is_sixteen_sector));
			}

			if(has_scsi_card) {
				// Rounding the clock rate slightly shouldn't matter, but:
				// TODO: be [slightly] more honest about clock rate.
				install_card(SCSISlot, new Apple::II::SCSICard(roms, int(master_clock / 14.0f)));
			}

			if(target.has_mockingboard) {
				// The Mockingboard has a parasitic relationship with this class due to the way
				// that audio outputs are implemented in this emulator.
				install_card(MockingboardSlot, new Apple::II::Mockingboard(ays_));
			}

			rom_ = std::move(roms.find(system)->second);
			// The IIe and Enhanced IIe ROMs often distributed are oversized; trim if necessary.
			if(system == ROM::Name::AppleIIe || system == ROM::Name::AppleIIEnhancedE) {
				if(rom_.size() > 16128) {
					rom_.erase(rom_.begin(), rom_.end() - 16128);
				}
			}
			video_.set_character_rom(roms.find(character)->second);

			// Set up the default memory blocks. On a II or II+ these values will never change.
			// On a IIe they'll be affected by selection of auxiliary RAM.
			set_paging<PagingType::Main | PagingType::ZeroPage>();

			// Set the whole card area to initially backed by nothing.
			page(0xc0, 0xd0, nullptr, nullptr);

			insert_media(target.media);
		}